

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O0

void duckdb::MedianAbsoluteDeviationOperation<duckdb::dtime_t>::
     Finalize<duckdb::interval_t,duckdb::QuantileState<duckdb::dtime_t,duckdb::QuantileStandardType>>
               (QuantileState<duckdb::dtime_t,_duckdb::QuantileStandardType> *state,
               interval_t *target,AggregateFinalizeData *finalize_data)

{
  bool bVar1;
  reference pvVar2;
  undefined8 *in_RSI;
  vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_> *in_RDI;
  interval_t iVar3;
  QuantileDirect<duckdb::dtime_t> *in_stack_00000010;
  MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t> accessor;
  dtime_t *in_stack_00000020;
  dtime_t med;
  Interpolator<false> interp;
  value_type *q;
  QuantileBindData *bind_data;
  size_type in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff80 [16];
  MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t> in_stack_ffffffffffffff90;
  MEDIAN_TYPE local_60 [4];
  AggregateFinalizeData *in_stack_ffffffffffffffc0;
  undefined1 desc_p;
  
  bVar1 = std::vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>::empty
                    ((vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_> *)
                     in_stack_ffffffffffffff90.median);
  if (bVar1) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffc0);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->(in_stack_ffffffffffffff80._0_8_);
    FunctionData::Cast<duckdb::QuantileBindData>(in_stack_ffffffffffffff80._0_8_);
    pvVar2 = vector<duckdb::QuantileValue,_true>::operator[]
                       (in_stack_ffffffffffffff80._0_8_,in_stack_ffffffffffffff78);
    desc_p = (undefined1)((ulong)pvVar2 >> 0x38);
    std::vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>::size(in_RDI);
    Interpolator<false>::Interpolator
              ((Interpolator<false> *)in_stack_ffffffffffffff90.median,
               in_stack_ffffffffffffff80._8_8_,in_stack_ffffffffffffff80._0_8_,(bool)desc_p);
    std::vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>::data
              ((vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_> *)0xae8a03);
    local_60[0].micros =
         (int64_t)Interpolator<false>::
                  Operation<duckdb::dtime_t,duckdb::dtime_t,duckdb::QuantileDirect<duckdb::dtime_t>>
                            (med.micros,in_stack_00000020,(Vector *)accessor.median,
                             in_stack_00000010);
    MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>::MadAccessor
              ((MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t> *)
               &stack0xffffffffffffff90,local_60);
    std::vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>::data
              ((vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_> *)0xae8a3e);
    iVar3 = Interpolator<false>::
            Operation<duckdb::dtime_t,duckdb::interval_t,duckdb::MadAccessor<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>>
                      ((Interpolator<false> *)q,(dtime_t *)interp.end,(Vector *)interp.begin,
                       (MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t> *)
                       interp.CRN);
    *in_RSI = iVar3._0_8_;
    in_RSI[1] = iVar3.micros;
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		using INPUT_TYPE = typename STATE::InputType;
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto &q = bind_data.quantiles[0];
		Interpolator<false> interp(q, state.v.size(), false);
		const auto med = interp.template Operation<INPUT_TYPE, MEDIAN_TYPE>(state.v.data(), finalize_data.result);

		MadAccessor<INPUT_TYPE, T, MEDIAN_TYPE> accessor(med);
		target = interp.template Operation<INPUT_TYPE, T>(state.v.data(), finalize_data.result, accessor);
	}